

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_compiler.hpp
# Opt level: O1

sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
boost::xpressive::
regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
::parse_quant<char_const*>
          (sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,
          regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
          *this,char **begin,char *end)

{
  counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pcVar1;
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar2;
  dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pdVar3;
  shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tmp;
  quant_spec local_70;
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  
  local_70.hidden_mark_count_ = (size_t *)(this + 8);
  local_70.greedy_ = false;
  local_70.min_ = 0;
  local_70.max_ = 0;
  parse_atom<char_const*>(__return_storage_ptr__,this,begin,end);
  if ((((__return_storage_ptr__->head_).xpr_.px !=
        (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) && (*begin != end)) && (__return_storage_ptr__->quant_ != quant_none)) {
    bVar7 = compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
            ::get_quant_spec<char_const*>
                      ((compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                        *)(this + 0x10),begin,end,&local_70);
    if (bVar7) {
      if (local_70.max_ == 0) {
        parse_quant<char_const*>(&local_58,this,begin,end);
        sVar4.xpr_.px = local_58.head_.xpr_.px;
        __return_storage_ptr__->quant_ = local_58.quant_;
        __return_storage_ptr__->pure_ = local_58.pure_;
        *(undefined3 *)&__return_storage_ptr__->field_0x1 = local_58._1_3_;
        *(undefined4 *)&__return_storage_ptr__->field_0x4 = local_58._4_4_;
        *(undefined4 *)&(__return_storage_ptr__->width_).value_ = (undefined4)local_58.width_.value_
        ;
        *(undefined4 *)((long)&(__return_storage_ptr__->width_).value_ + 4) =
             local_58.width_.value_._4_4_;
        local_58.head_.xpr_.px =
             (matchable_ptr)
             (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0;
        pmVar2 = (__return_storage_ptr__->head_).xpr_.px;
        (__return_storage_ptr__->head_).xpr_.px =
             (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)sVar4.xpr_.px;
        if (pmVar2 != (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)0x0) {
          LOCK();
          pcVar1 = &pmVar2->
                    super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ;
          (pcVar1->count_).value_ = (pcVar1->count_).value_ + -1;
          UNLOCK();
          if ((pcVar1->count_).value_ == 0) {
            (*(pmVar2->
              super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_matchable[1])();
          }
        }
        pdVar3 = (__return_storage_ptr__->alt_end_xpr_).px;
        uVar5 = local_58.alt_end_xpr_.px._0_4_;
        uVar6 = local_58.alt_end_xpr_.px._4_4_;
        local_58.alt_end_xpr_.px =
             (dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0;
        *(undefined4 *)&__return_storage_ptr__->tail_ = local_58.tail_._0_4_;
        *(undefined4 *)((long)&__return_storage_ptr__->tail_ + 4) = local_58.tail_._4_4_;
        *(undefined4 *)&(__return_storage_ptr__->alt_end_xpr_).px = uVar5;
        *(undefined4 *)((long)&(__return_storage_ptr__->alt_end_xpr_).px + 4) = uVar6;
        if (pdVar3 != (dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)0x0) {
          LOCK();
          pcVar1 = &(pdVar3->
                    super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ).
                    super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ;
          (pcVar1->count_).value_ = (pcVar1->count_).value_ + -1;
          UNLOCK();
          if ((pcVar1->count_).value_ == 0) {
            (*(pdVar3->
              super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).
              super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._vptr_matchable[1])();
          }
        }
        __return_storage_ptr__->alternates_ = local_58.alternates_;
        if (local_58.alt_end_xpr_.px !=
            (dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x0) {
          LOCK();
          pcVar1 = &((local_58.alt_end_xpr_.px)->
                    super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ).
                    super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ;
          (pcVar1->count_).value_ = (pcVar1->count_).value_ + -1;
          UNLOCK();
          if ((pcVar1->count_).value_ == 0) {
            (*((local_58.alt_end_xpr_.px)->
              super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).
              super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._vptr_matchable[1])();
          }
        }
        if (local_58.head_.xpr_.px !=
            (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x0) {
          LOCK();
          pcVar1 = (counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)((long)local_58.head_.xpr_.px + 8);
          (pcVar1->count_).value_ = (pcVar1->count_).value_ + -1;
          UNLOCK();
          if ((pcVar1->count_).value_ == 0) {
            (*((matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_58.head_.xpr_.px)->_vptr_matchable[1])();
          }
        }
      }
      else {
        pmVar2 = (__return_storage_ptr__->head_).xpr_.px;
        (*(pmVar2->
          super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._vptr_matchable[5])(pmVar2,&local_70,__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

detail::sequence<BidiIter> parse_quant(FwdIter &begin, FwdIter end)
    {
        BOOST_ASSERT(begin != end);
        detail::quant_spec spec = { 0, 0, false, &this->hidden_mark_count_ };
        detail::sequence<BidiIter> seq = this->parse_atom(begin, end);

        // BUGBUG this doesn't handle the degenerate (?:)+ correctly
        if(!seq.empty() && begin != end && detail::quant_none != seq.quant())
        {
            if(this->traits_.get_quant_spec(begin, end, spec))
            {
                BOOST_ASSERT(spec.min_ <= spec.max_);

                if(0 == spec.max_) // quant {0,0} is degenerate -- matches nothing.
                {
                    seq = this->parse_quant(begin, end);
                }
                else
                {
                    seq.repeat(spec);
                }
            }
        }

        return seq;
    }